

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O0

shared_ptr<SchemeObject> __thiscall SchemePromise::force(SchemePromise *this)

{
  bool bVar1;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<SchemeObject> sVar2;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> local_68;
  ExecutionResult local_48;
  SchemePromise *this_local;
  
  this_local = this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 8));
  if (!bVar1) {
    this_00 = std::
              __shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(in_RSI + 0x18));
    local_68.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
    local_68.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
    local_68.
    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
    ._M_impl._M_node._M_size = 0;
    std::__cxx11::
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::list
              (&local_68);
    SchemeProcedure::execute(&local_48,&this_00->super_SchemeProcedure,&local_68);
    ExecutionResult::force_value((ExecutionResult *)&stack0xffffffffffffffd8);
    std::shared_ptr<SchemeObject>::operator=
              ((shared_ptr<SchemeObject> *)(in_RSI + 8),
               (shared_ptr<SchemeObject> *)&stack0xffffffffffffffd8);
    std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)&stack0xffffffffffffffd8)
    ;
    ExecutionResult::~ExecutionResult(&local_48);
    std::__cxx11::
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::~list
              (&local_68);
    std::__shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<SchemeCompoundProcedure,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x18))
    ;
  }
  std::shared_ptr<SchemeObject>::shared_ptr
            ((shared_ptr<SchemeObject> *)this,(shared_ptr<SchemeObject> *)(in_RSI + 8));
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_SchemeObject;
  return (shared_ptr<SchemeObject>)
         sVar2.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SchemeObject> SchemePromise::force()
{
    if(!value)
    {
        value = func->execute({}).force_value();
        func.reset();
    }
    return value;
}